

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SameLine(float pos_x,float spacing_w)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *window;
  float spacing_w_local;
  float pos_x_local;
  
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->SkipItems & 1U) == 0) {
    window._0_4_ = spacing_w;
    if ((pos_x != 0.0) || (NAN(pos_x))) {
      if (spacing_w < 0.0) {
        window._0_4_ = 0.0;
      }
      (pIVar1->DC).CursorPos.x =
           ((pIVar1->Pos).x - (pIVar1->Scroll).x) + pos_x + window._0_4_ + (pIVar1->DC).GroupOffsetX
           + (pIVar1->DC).ColumnsOffsetX;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    else {
      if (spacing_w < 0.0) {
        window._0_4_ = (GImGui->Style).ItemSpacing.x;
      }
      (pIVar1->DC).CursorPos.x = (pIVar1->DC).CursorPosPrevLine.x + window._0_4_;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    }
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  return;
}

Assistant:

void ImGui::SameLine(float pos_x, float spacing_w)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    if (pos_x != 0.0f)
    {
        if (spacing_w < 0.0f) spacing_w = 0.0f;
        window->DC.CursorPos.x = window->Pos.x - window->Scroll.x + pos_x + spacing_w + window->DC.GroupOffsetX + window->DC.ColumnsOffsetX;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    else
    {
        if (spacing_w < 0.0f) spacing_w = g.Style.ItemSpacing.x;
        window->DC.CursorPos.x = window->DC.CursorPosPrevLine.x + spacing_w;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    window->DC.CurrentLineHeight = window->DC.PrevLineHeight;
    window->DC.CurrentLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
}